

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O0

void print_ir(FILE *io,uint depth,void *_ir)

{
  uint depth_00;
  uint local_34;
  char *pcStack_30;
  int i;
  char *fname;
  MOJOSHADER_irNode *ir;
  void *_ir_local;
  uint depth_local;
  FILE *io_local;
  
  if (_ir != (void *)0x0) {
    pcStack_30 = strrchr(*(char **)((long)_ir + 8),0x2f);
    if (pcStack_30 == (char *)0x0) {
      pcStack_30 = strrchr(*(char **)((long)_ir + 8),0x5c);
      if (pcStack_30 == (char *)0x0) {
        pcStack_30 = *(char **)((long)_ir + 8);
      }
      else {
        pcStack_30 = pcStack_30 + 1;
      }
    }
    else {
      pcStack_30 = pcStack_30 + 1;
    }
    for (local_34 = 0; local_34 < depth; local_34 = local_34 + 1) {
      fprintf((FILE *)io,"  ");
    }
    depth_00 = depth + 1;
    fprintf((FILE *)io,"[ %s:%d ",pcStack_30,(ulong)*(uint *)((long)_ir + 0x10));
    switch(*_ir) {
    case 1:
      fprintf((FILE *)io,"CONSTANT ");
      if (*(int *)((long)_ir + 0x18) - 1U < 3) {
        for (local_34 = 0; (int)local_34 < *(int *)((long)_ir + 0x1c) + -1; local_34 = local_34 + 1)
        {
          fprintf((FILE *)io,"%d, ",(ulong)*(uint *)((long)_ir + (long)(int)local_34 * 4 + 0x20));
        }
        if (0 < *(int *)((long)_ir + 0x1c)) {
          fprintf((FILE *)io,"%d",(ulong)*(uint *)((long)_ir + (long)(int)local_34 * 4 + 0x20));
        }
      }
      else {
        if (4 < *(int *)((long)_ir + 0x18) - 4U) {
          __assert_fail("0 && \"shouldn\'t happen\"",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                        ,0x1643,"void print_ir(FILE *, unsigned int, void *)");
        }
        for (local_34 = 0; (int)local_34 < *(int *)((long)_ir + 0x1c) + -1; local_34 = local_34 + 1)
        {
          fprintf((FILE *)io,"%ff, ",(double)*(float *)((long)_ir + (long)(int)local_34 * 4 + 0x20))
          ;
        }
        if (0 < *(int *)((long)_ir + 0x1c)) {
          fprintf((FILE *)io,"%ff",(double)*(float *)((long)_ir + (long)(int)local_34 * 4 + 0x20));
        }
      }
      fprintf((FILE *)io," ]\n");
      break;
    case 2:
      fprintf((FILE *)io,"TEMP %d ]\n",(ulong)*(uint *)((long)_ir + 0x20));
      break;
    case 3:
      fprintf((FILE *)io,"BINOP ");
      switch(*(undefined4 *)((long)_ir + 0x20)) {
      case 0:
        fprintf((FILE *)io,"ADD");
        break;
      case 1:
        fprintf((FILE *)io,"SUBTRACT");
        break;
      case 2:
        fprintf((FILE *)io,"MULTIPLY");
        break;
      case 3:
        fprintf((FILE *)io,"DIVIDE");
        break;
      case 4:
        fprintf((FILE *)io,"MODULO");
        break;
      case 5:
        fprintf((FILE *)io,"AND");
        break;
      case 6:
        fprintf((FILE *)io,"OR");
        break;
      case 7:
        fprintf((FILE *)io,"XOR");
        break;
      case 8:
        fprintf((FILE *)io,"LSHIFT");
        break;
      case 9:
        fprintf((FILE *)io,"RSHIFT");
        break;
      case 10:
        fprintf((FILE *)io,"UNKNOWN");
        break;
      default:
        __assert_fail("0 && \"unexpected case\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                      ,0x1674,"void print_ir(FILE *, unsigned int, void *)");
      }
      fprintf((FILE *)io," ]\n");
      print_ir(io,depth_00,*(void **)((long)_ir + 0x28));
      print_ir(io,depth_00,*(void **)((long)_ir + 0x30));
      break;
    case 4:
      fprintf((FILE *)io,"MEMORY %d ]\n",(ulong)*(uint *)((long)_ir + 0x20));
      break;
    case 5:
      fprintf((FILE *)io,"CALL %d ]\n",(ulong)*(uint *)((long)_ir + 0x20));
      print_ir(io,depth_00,*(void **)((long)_ir + 0x28));
      break;
    case 6:
      fprintf((FILE *)io,"ESEQ ]\n");
      print_ir(io,depth_00,*(void **)((long)_ir + 0x20));
      break;
    case 7:
      fprintf((FILE *)io,"ARRAY ]\n");
      print_ir(io,depth_00,*(void **)((long)_ir + 0x20));
      print_ir(io,depth_00,*(void **)((long)_ir + 0x28));
      break;
    case 8:
      fprintf((FILE *)io,"CONVERT ]\n");
      print_ir(io,depth_00,*(void **)((long)_ir + 0x20));
      break;
    case 9:
      fprintf((FILE *)io,"SWIZZLE");
      for (local_34 = 0; (int)local_34 < *(int *)((long)_ir + 0x1c) + -1; local_34 = local_34 + 1) {
        fprintf((FILE *)io," %d",(ulong)(uint)(int)*(char *)((long)_ir + (long)(int)local_34 + 0x28)
               );
      }
      fprintf((FILE *)io," ]\n");
      print_ir(io,depth_00,*(void **)((long)_ir + 0x20));
      break;
    case 10:
      fprintf((FILE *)io,"CONSTRUCT ]\n");
      print_ir(io,depth_00,*(void **)((long)_ir + 0x20));
      break;
    default:
      __assert_fail("0 && \"unexpected IR node\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                    ,0x16bf,"void print_ir(FILE *, unsigned int, void *)");
    case 0xd:
      fprintf((FILE *)io,"MOVE ]\n");
      print_ir(io,depth_00,*(void **)((long)_ir + 0x18));
      print_ir(io,depth_00,*(void **)((long)_ir + 0x20));
      break;
    case 0xe:
      fprintf((FILE *)io,"EXPRSTMT ]\n");
      print_ir(io,depth_00,*(void **)((long)_ir + 0x18));
      break;
    case 0xf:
      fprintf((FILE *)io,"JUMP %d ]\n",(ulong)*(uint *)((long)_ir + 0x18));
      break;
    case 0x10:
      fprintf((FILE *)io,"CJUMP ");
      switch(*(undefined4 *)((long)_ir + 0x18)) {
      case 0:
        fprintf((FILE *)io,"EQL");
        break;
      case 1:
        fprintf((FILE *)io,"NEQ");
        break;
      case 2:
        fprintf((FILE *)io,"LT");
        break;
      case 3:
        fprintf((FILE *)io,"GT");
        break;
      case 4:
        fprintf((FILE *)io,"LEQ");
        break;
      case 5:
        fprintf((FILE *)io,"GEQ");
        break;
      case 6:
        fprintf((FILE *)io,"UNKNOWN");
        break;
      default:
        __assert_fail("0 && \"unexpected case\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                      ,0x16ac,"void print_ir(FILE *, unsigned int, void *)");
      }
      fprintf((FILE *)io," %d %d ]\n",(ulong)*(uint *)((long)_ir + 0x30),
              (ulong)*(uint *)((long)_ir + 0x34));
      print_ir(io,depth_00,*(void **)((long)_ir + 0x20));
      print_ir(io,depth_00,*(void **)((long)_ir + 0x28));
      break;
    case 0x11:
      fprintf((FILE *)io,"SEQ ]\n");
      print_ir(io,depth_00,*(void **)((long)_ir + 0x18));
      print_ir(io,depth_00,*(void **)((long)_ir + 0x20));
      break;
    case 0x12:
      fprintf((FILE *)io,"LABEL %d ]\n",(ulong)*(uint *)((long)_ir + 0x18));
      break;
    case 0x13:
      fprintf((FILE *)io,"DISCARD ]\n");
      break;
    case 0x16:
      fprintf((FILE *)io,"EXPRLIST ]\n");
      print_ir(io,depth_00,*(void **)((long)_ir + 0x18));
      print_ir(io,depth_00,*(void **)((long)_ir + 0x20));
    }
  }
  return;
}

Assistant:

static void print_ir(FILE *io, unsigned int depth, void *_ir)
{
    MOJOSHADER_irNode *ir = (MOJOSHADER_irNode *) _ir;
    if (ir == NULL)
        return;

    const char *fname = strrchr(ir->ir.filename, '/');
    if (fname != NULL)
        fname++;
    else
    {
        fname = strrchr(ir->ir.filename, '\\');
        if (fname != NULL)
            fname++;
        else
            fname = ir->ir.filename;
    } // else

    int i;
    for (i = 0; i < depth; i++)
        fprintf(io, "  ");
    depth++;

    fprintf(io, "[ %s:%d ", fname, ir->ir.line);

    switch (ir->ir.type)
    {
        case MOJOSHADER_IR_LABEL:
            fprintf(io, "LABEL %d ]\n", ir->stmt.label.index);
            break;

        case MOJOSHADER_IR_CONSTANT:
            fprintf(io, "CONSTANT ");
            switch (ir->expr.constant.info.type)
            {
                case MOJOSHADER_AST_DATATYPE_BOOL:
                case MOJOSHADER_AST_DATATYPE_INT:
                case MOJOSHADER_AST_DATATYPE_UINT:
                    for (i = 0; i < ir->expr.constant.info.elements-1; i++)
                        fprintf(io, "%d, ", ir->expr.constant.value.ival[i]);
                    if (ir->expr.constant.info.elements > 0)
                        fprintf(io, "%d", ir->expr.constant.value.ival[i]);
                    break;

                case MOJOSHADER_AST_DATATYPE_FLOAT:
                case MOJOSHADER_AST_DATATYPE_FLOAT_SNORM:
                case MOJOSHADER_AST_DATATYPE_FLOAT_UNORM:
                case MOJOSHADER_AST_DATATYPE_HALF:
                case MOJOSHADER_AST_DATATYPE_DOUBLE:
                    for (i = 0; i < ir->expr.constant.info.elements-1; i++)
                        fprintf(io, "%ff, ", ir->expr.constant.value.fval[i]);
                    if (ir->expr.constant.info.elements > 0)
                        fprintf(io, "%ff", ir->expr.constant.value.fval[i]);
                    break;

                default: assert(0 && "shouldn't happen");
            } // switch
            fprintf(io, " ]\n");
            break;

        case MOJOSHADER_IR_TEMP:
            fprintf(io, "TEMP %d ]\n", ir->expr.temp.index);
            break;

        case MOJOSHADER_IR_DISCARD:
            fprintf(io, "DISCARD ]\n");
            break;

        case MOJOSHADER_IR_SWIZZLE:
            fprintf(io, "SWIZZLE");
            for (i = 0; i < ir->expr.swizzle.info.elements-1; i++)
                fprintf(io, " %d", (int) ir->expr.swizzle.channels[i]);
            fprintf(io, " ]\n");
            print_ir(io, depth, ir->expr.swizzle.expr);
            break;

        case MOJOSHADER_IR_CONSTRUCT:
            fprintf(io, "CONSTRUCT ]\n");
            print_ir(io, depth, ir->expr.construct.args);
            break;

        case MOJOSHADER_IR_CONVERT:
            fprintf(io, "CONVERT ]\n");
            print_ir(io, depth, ir->expr.convert.expr);
            break;

        case MOJOSHADER_IR_BINOP:
            fprintf(io, "BINOP ");
            switch (ir->expr.binop.op)
            {
                #define PRINT_IR_BINOP(x) \
                    case MOJOSHADER_IR_BINOP_##x: fprintf(io, #x); break;
                PRINT_IR_BINOP(ADD)
                PRINT_IR_BINOP(SUBTRACT)
                PRINT_IR_BINOP(MULTIPLY)
                PRINT_IR_BINOP(DIVIDE)
                PRINT_IR_BINOP(MODULO)
                PRINT_IR_BINOP(AND)
                PRINT_IR_BINOP(OR)
                PRINT_IR_BINOP(XOR)
                PRINT_IR_BINOP(LSHIFT)
                PRINT_IR_BINOP(RSHIFT)
                PRINT_IR_BINOP(UNKNOWN)
                #undef PRINT_IR_BINOP
                default: assert(0 && "unexpected case"); break;
            } // switch
            fprintf(io, " ]\n");
            print_ir(io, depth, ir->expr.binop.left);
            print_ir(io, depth, ir->expr.binop.right);
            break;

        case MOJOSHADER_IR_MEMORY:
            fprintf(io, "MEMORY %d ]\n", ir->expr.memory.index);
            break;

        case MOJOSHADER_IR_CALL:
            fprintf(io, "CALL %d ]\n", ir->expr.call.index);
            print_ir(io, depth, ir->expr.call.args);
            break;

        case MOJOSHADER_IR_ESEQ:
            fprintf(io, "ESEQ ]\n");
            print_ir(io, depth, ir->expr.eseq.stmt);
            break;

        case MOJOSHADER_IR_ARRAY:
            fprintf(io, "ARRAY ]\n");
            print_ir(io, depth, ir->expr.array.array);
            print_ir(io, depth, ir->expr.array.element);
            break;

        case MOJOSHADER_IR_MOVE:
            fprintf(io, "MOVE ]\n");
            print_ir(io, depth, ir->stmt.move.dst);
            print_ir(io, depth, ir->stmt.move.src);
            break;

        case MOJOSHADER_IR_EXPR_STMT:
            fprintf(io, "EXPRSTMT ]\n");
            print_ir(io, depth, ir->stmt.expr.expr);
            break;

        case MOJOSHADER_IR_JUMP:
            fprintf(io, "JUMP %d ]\n", ir->stmt.jump.label);
            break;

        case MOJOSHADER_IR_CJUMP:
            fprintf(io, "CJUMP ");
            switch (ir->stmt.cjump.cond)
            {
                #define PRINT_IR_COND(x) \
                    case MOJOSHADER_IR_COND_##x: fprintf(io, #x); break;
                PRINT_IR_COND(EQL)
                PRINT_IR_COND(NEQ)
                PRINT_IR_COND(LT)
                PRINT_IR_COND(GT)
                PRINT_IR_COND(LEQ)
                PRINT_IR_COND(GEQ)
                PRINT_IR_COND(UNKNOWN)
                #undef PRINT_IR_COND
                default: assert(0 && "unexpected case"); break;
            } // switch
            fprintf(io, " %d %d ]\n", ir->stmt.cjump.iftrue, ir->stmt.cjump.iffalse);
            print_ir(io, depth, ir->stmt.cjump.left);
            print_ir(io, depth, ir->stmt.cjump.right);
            break;

        case MOJOSHADER_IR_SEQ:
            fprintf(io, "SEQ ]\n");
            print_ir(io, depth, ir->stmt.seq.first);
            print_ir(io, depth, ir->stmt.seq.next);  // !!! FIXME: don't recurse?
            break;

        case MOJOSHADER_IR_EXPRLIST:
            fprintf(io, "EXPRLIST ]\n");
            print_ir(io, depth, ir->misc.exprlist.expr);
            print_ir(io, depth, ir->misc.exprlist.next);  // !!! FIXME: don't recurse?
            break;

        default: assert(0 && "unexpected IR node"); break;
    } // switch
}